

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.cpp
# Opt level: O3

string_view mjs::trim(string_view *s)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  string_view sVar8;
  
  sVar1 = s->_M_len;
  if (sVar1 == 0) {
    sVar6 = 0;
  }
  else {
    pcVar4 = s->_M_str;
    sVar3 = 0;
    sVar5 = sVar1;
    do {
      iVar2 = isblank((int)pcVar4[sVar3]);
      if (iVar2 == 0) {
        sVar6 = sVar3;
        if (sVar5 != 0) {
          pcVar4 = s->_M_str;
          sVar6 = sVar1;
          goto LAB_00126079;
        }
        break;
      }
      sVar3 = sVar3 + 1;
      sVar5 = sVar5 - 1;
      sVar6 = sVar1;
    } while (sVar3 != sVar1);
  }
  sVar3 = sVar6;
  pcVar4 = s->_M_str;
  uVar7 = 0;
  goto LAB_001260a2;
  while (sVar6 = sVar6 - 1, sVar3 != sVar6) {
LAB_00126079:
    iVar2 = isblank((int)pcVar4[sVar6 - 1]);
    if (iVar2 == 0) {
      uVar7 = sVar6 - sVar3;
      if (sVar1 - sVar3 < sVar6 - sVar3) {
        uVar7 = sVar1 - sVar3;
      }
      goto LAB_001260a2;
    }
  }
  uVar7 = 0;
LAB_001260a2:
  sVar8._M_str = pcVar4 + sVar3;
  sVar8._M_len = uVar7;
  return sVar8;
}

Assistant:

std::string_view trim(const std::string_view& s) {
    size_t pos = 0, len = s.length();
    while (pos < s.length() && isblank(s[pos]))
        ++pos, --len;
    while (len && isblank(s[pos+len-1]))
        --len;
    return s.substr(pos, len);
}